

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O2

void __thiscall SBLA::FirstScan(SBLA *this)

{
  char cVar1;
  Mat1b *pMVar2;
  char *pcVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  int local_ec;
  int local_e0;
  long local_c0;
  Mat local_90 [96];
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar23 = *(int *)&pMVar2->field_0xc;
  this->N = iVar23;
  iVar12 = *(int *)&pMVar2->field_0x8;
  this->M = iVar12;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,iVar12,iVar23);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pcVar3 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
  cVar1 = *pcVar3;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = cVar1;
  if (cVar1 == '\0') {
    uVar10 = (ulong)(uint)this->N;
    goto LAB_001c6177;
  }
  *pcVar3 = '\0';
  uVar9 = this->N;
  uVar10 = (ulong)uVar9;
  if (this->M == 1) {
    if (uVar9 != 1) {
      cVar1 = *(char *)(*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x10 + 1);
LAB_001c6156:
      uVar9 = (uint)(cVar1 == '\0');
LAB_001c6174:
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
      goto LAB_001c6177;
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 1;
  }
  else {
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar27 = *(long *)&pMVar2->field_0x10;
    if (uVar9 != 1) {
      uVar9 = 0;
      if ((*(char *)(lVar27 + 1) == '\0') &&
         (*(char *)(lVar27 + **(long **)&pMVar2->field_0x48) == '\0')) {
        cVar1 = *(char *)(lVar27 + 1 + **(long **)&pMVar2->field_0x48);
        goto LAB_001c6156;
      }
      goto LAB_001c6174;
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
         (uint)(*(char *)(lVar27 + **(long **)&pMVar2->field_0x48) == '\0');
  }
  uVar10 = 1;
LAB_001c6177:
  local_ec = (int)uVar10;
  iVar23 = local_ec * 2;
  uVar9 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  uVar18 = 0;
  local_c0 = 1;
  iVar12 = 0;
  lVar27 = 0;
  do {
    if ((long)((long)(int)uVar9 & 0xfffffffffffffffeU) <= (long)uVar18) {
      if ((uVar9 & 0x80000001) == 1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar14 = *(long *)&pMVar4->field_0x10;
        lVar15 = **(long **)&pMVar4->field_0x48;
        lVar24 = (uVar18 & 0xffffffff) * lVar15 + lVar14;
        lVar14 = lVar15 * uVar18 + lVar14;
        lVar15 = **(long **)&pMVar2->field_0x48;
        lVar13 = *(long *)&pMVar2->field_0x10;
        for (lVar17 = 0; lVar17 < (int)uVar10; lVar17 = lVar17 + 1) {
          *(uint *)(lVar14 + lVar17 * 4) = (uint)*(byte *)(lVar15 * uVar18 + lVar13 + lVar17);
          uVar10 = (ulong)(uint)this->N;
        }
        iVar23 = 0;
        while (iVar23 < (int)uVar10) {
          lVar15 = (long)iVar23;
          iVar21 = iVar23;
          if (*(int *)(lVar24 + lVar15 * 4) != 0) {
            iVar8 = iVar12 + iVar23;
            do {
              iVar11 = iVar21;
              lVar15 = lVar15 + 1;
              *(int *)(lVar14 + -4 + lVar15 * 4) = -iVar8;
              uVar10 = (ulong)this->N;
              if ((long)uVar10 <= lVar15) break;
              iVar21 = iVar11 + 1;
            } while (*(int *)(lVar14 + lVar15 * 4) != 0);
            iVar21 = iVar11 + 1;
            if (uVar18 != 0) {
              iVar19 = -0x80000000;
              for (; iVar23 <= iVar11; iVar23 = iVar23 + 1) {
                lVar15 = (long)iVar23;
                if (*(int *)(lVar24 + lVar15 * 4) != 0) {
                  iVar7 = 1;
                  if (1 < iVar23) {
                    iVar7 = iVar23;
                  }
                  uVar9 = iVar7 - 1;
                  iVar7 = this->N;
                  iVar22 = iVar23;
                  iVar28 = iVar23 + 1;
                  if (iVar23 + 1 < iVar7) {
                    iVar28 = iVar7;
                  }
                  do {
                    lVar15 = lVar15 + 1;
                    iVar23 = iVar28;
                    if (iVar7 <= lVar15) break;
                    iVar23 = iVar22 + 1;
                    iVar22 = iVar23;
                  } while (*(int *)(lVar14 + lVar15 * 4) != 0);
                  iVar28 = iVar7 + -1;
                  if (iVar23 < iVar7 + -1) {
                    iVar28 = iVar23;
                  }
                  while (uVar10 = (ulong)uVar9, (int)uVar9 <= iVar28) {
                    uVar26 = (ulong)(int)uVar9;
                    iVar7 = *(int *)(lVar27 + uVar26 * 4);
                    if (iVar7 != 0) {
                      iVar7 = FindRoot(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,iVar7);
                      if (iVar19 < iVar7) {
                        piVar20 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                            img_labels_)->field_0x10;
                        iVar19 = iVar7;
                        iVar7 = -iVar8;
LAB_001c6634:
                        FindRootAndCompress(this,piVar20,iVar7,iVar19);
                      }
                      else if (iVar7 < iVar19) {
                        piVar20 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                            img_labels_)->field_0x10;
                        goto LAB_001c6634;
                      }
                      do {
                        if ((long)iVar28 <= (long)uVar26) {
                          uVar10 = (ulong)(iVar28 + 1);
                          break;
                        }
                        uVar10 = uVar26 + 1;
                        lVar15 = uVar26 * 4;
                        uVar26 = uVar10;
                      } while (*(int *)(lVar27 + 4 + lVar15) != 0);
                    }
                    uVar9 = (int)uVar10 + 1;
                  }
                }
              }
              uVar10 = (ulong)(uint)this->N;
            }
          }
          iVar23 = iVar21 + 1;
        }
      }
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar13 = *(long *)&pMVar2->field_0x10;
    lVar17 = **(long **)&pMVar2->field_0x48;
    lVar24 = *(long *)&pMVar4->field_0x10;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar14 = lVar24 + lVar5 * uVar18;
    lVar15 = lVar14 + lVar5;
    for (lVar25 = 0; lVar25 < (int)uVar10; lVar25 = lVar25 + 1) {
      *(uint *)(lVar14 + lVar25 * 4) = (uint)*(byte *)(lVar17 * uVar18 + lVar13 + lVar25);
      *(uint *)(lVar24 + lVar5 * local_c0 + lVar25 * 4) =
           (uint)*(byte *)(lVar17 * local_c0 + lVar13 + lVar25);
      uVar10 = (ulong)(uint)this->N;
    }
    iVar21 = 0;
    while (iVar21 < (int)uVar10) {
      lVar13 = (long)iVar21;
      iVar8 = *(int *)(lVar14 + lVar13 * 4);
      if (*(int *)(lVar15 + lVar13 * 4) == 0) {
        iVar11 = iVar21;
        if (iVar8 != 0) {
          iVar19 = -(iVar21 + iVar12);
          goto LAB_001c62ab;
        }
      }
      else {
        iVar19 = -(iVar21 + local_ec);
        *(int *)(lVar15 + lVar13 * 4) = iVar19;
        if (iVar8 != 0) {
LAB_001c62ab:
          *(int *)(lVar14 + lVar13 * 4) = iVar19;
        }
        lVar17 = lVar24 + lVar5 * uVar18 + 4 + lVar13 * 4;
        lVar25 = lVar24 + lVar5 * local_c0 + 4 + lVar13 * 4;
        for (lVar16 = 0; uVar10 = (ulong)this->N, lVar13 + 1 + lVar16 < (long)uVar10;
            lVar16 = lVar16 + 1) {
          iVar8 = *(int *)(lVar17 + lVar16 * 4);
          if (*(int *)(lVar25 + lVar16 * 4) == 0) {
            if (iVar8 == 0) break;
LAB_001c6300:
            *(int *)(lVar17 + lVar16 * 4) = iVar19;
          }
          else {
            *(int *)(lVar25 + lVar16 * 4) = iVar19;
            if (iVar8 != 0) goto LAB_001c6300;
          }
        }
        iVar11 = iVar21 + (int)lVar16 + 1;
        if (uVar18 != 0) {
          local_e0 = iVar21 + (int)lVar16;
          iVar8 = -0x80000000;
          for (; iVar21 <= local_e0; iVar21 = iVar21 + 1) {
            lVar13 = (long)iVar21;
            if (*(int *)(lVar14 + lVar13 * 4) != 0) {
              iVar7 = 1;
              if (1 < iVar21) {
                iVar7 = iVar21;
              }
              uVar6 = iVar7 - 1;
              iVar7 = this->N;
              iVar28 = iVar21 + 1;
              if (iVar21 + 1 < iVar7) {
                iVar28 = iVar7;
              }
              do {
                lVar13 = lVar13 + 1;
                iVar22 = iVar28;
                if (iVar7 <= lVar13) break;
                iVar21 = iVar21 + 1;
                iVar22 = iVar21;
              } while (*(int *)(lVar14 + lVar13 * 4) != 0);
              iVar21 = iVar22;
              iVar28 = iVar7 + -1;
              if (iVar21 < iVar7 + -1) {
                iVar28 = iVar21;
              }
              while (uVar10 = (ulong)uVar6, (int)uVar6 <= iVar28) {
                uVar26 = (ulong)(int)uVar6;
                iVar7 = *(int *)(lVar27 + uVar26 * 4);
                if (iVar7 != 0) {
                  iVar7 = FindRoot(this,*(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>
                                                   ).img_labels_)->field_0x10,iVar7);
                  if (iVar8 < iVar7) {
                    piVar20 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                        img_labels_)->field_0x10;
                    iVar8 = iVar7;
                    iVar7 = iVar19;
LAB_001c63ff:
                    FindRootAndCompress(this,piVar20,iVar7,iVar8);
                  }
                  else if (iVar7 < iVar8) {
                    piVar20 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                        img_labels_)->field_0x10;
                    goto LAB_001c63ff;
                  }
                  do {
                    if ((long)iVar28 <= (long)uVar26) {
                      uVar10 = (ulong)(iVar28 + 1);
                      break;
                    }
                    uVar10 = uVar26 + 1;
                    lVar13 = uVar26 * 4;
                    uVar26 = uVar10;
                  } while (*(int *)(lVar27 + 4 + lVar13) != 0);
                }
                uVar6 = (int)uVar10 + 1;
              }
            }
          }
          uVar10 = (ulong)(uint)this->N;
        }
      }
      iVar21 = iVar11 + 1;
    }
    iVar12 = iVar12 + iVar23;
    local_ec = local_ec + iVar23;
    uVar18 = uVar18 + 2;
    local_c0 = local_c0 + 2;
    lVar27 = lVar15;
  } while( true );
}

Assistant:

void FirstScan()
    {
        N = img_.cols;
        M = img_.rows;
        img_labels_ = cv::Mat1i(M, N);

        // Fix for first pixel!
        n_labels_ = 0;
        firstpixel = img_.data[0];
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = 0;

            if (M == 1) {
                if (N == 1)
                    n_labels_ = 1;
                else
                    n_labels_ = img_.data[1] == 0;
            }
            else {
                if (N == 1)
                    n_labels_ = img_.data[img_.step[0]] == 0;
                else
                    n_labels_ = img_.data[1] == 0 && img_.data[img_.step[0]] == 0 && img_.data[img_.step[0] + 1] == 0;
            }
        }

        // Stripe extraction and representation
        unsigned int* img_labels_row_prev = nullptr;
        int rN = 0;
        int r1N = N;
        int N2 = N * 2;

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
                img_labels_row_fol[c] = img_row_fol[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];
                int oddpix = img_labels_row_fol[c];

                // Step 2
                int Gp;
                if (oddpix) {
                    img_labels_row_fol[c] = Gp = -(r1N + c);
                    if (evenpix)
                        img_labels_row[c] = Gp;
                }
                else if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];
                    int oddpix = img_labels_row_fol[c];

                    if (oddpix) {
                        img_labels_row_fol[c] = Gp;
                        if (evenpix)
                            img_labels_row[c] = Gp;
                    }
                    else if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
            img_labels_row_prev = img_labels_row_fol;
            rN += N2;
            r1N += N2;
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];

                // Step 2
                int Gp;
                if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];

                    if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
        }
    }